

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O3

void __thiscall CardProdNoAllocation::test_method(CardProdNoAllocation *this)

{
  void *size;
  void *size_00;
  double *__ptr;
  double *__ptr_00;
  double *__ptr_01;
  void *pvVar1;
  undefined8 *puVar2;
  char *pcVar3;
  Index cols;
  Index outer_stride_1;
  VectorXd x;
  MatrixXd J1;
  VectorXd p;
  VectorXd y;
  MatrixXd H2;
  MatrixXd H1;
  MatrixXd H0;
  MatrixXd J0;
  CartesianProduct S;
  CartesianProduct R2R3R2;
  CartesianProduct SO3R2R3R2;
  SO3<mnf::ExpMapMatrix> RotSpace;
  RealSpace R2;
  RealSpace R3;
  void *local_610;
  ulong local_608;
  void *local_600;
  ulong local_5f8;
  void *local_5e8;
  undefined8 uStack_5e0;
  void *local_5d8;
  void *pvStack_5d0;
  undefined8 local_5c8;
  void *pvStack_5c0;
  undefined8 uStack_5b8;
  void *local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  double *local_598;
  ulong uStack_590;
  void *local_588;
  void *local_580;
  ulong local_578;
  void *local_570;
  ulong local_568;
  void *local_560;
  ulong local_558;
  void *local_548;
  undefined8 uStack_540;
  void *local_538;
  ulong local_530;
  ulong local_528;
  void *local_520;
  ulong local_518;
  ulong local_510;
  void *local_508 [3];
  void *local_4f0 [3];
  void *local_4d8;
  ulong local_4d0;
  ulong local_4c8;
  ulong local_4c0;
  void *local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  ulong local_498;
  double *local_488;
  ulong local_480;
  void *local_478;
  ulong local_470;
  double *local_460;
  ulong local_458;
  void *local_450;
  ulong local_448;
  code *local_438 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_3e0 [24];
  void *local_3c8;
  void *local_3b0;
  double *local_398;
  undefined8 local_390;
  void *local_388;
  undefined8 local_380;
  double *local_370;
  void *local_368;
  double *local_358;
  void *local_350;
  double *local_340;
  void *local_338;
  double *local_328;
  undefined8 local_320;
  void *local_318;
  undefined8 local_310;
  code *local_300 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_2a8 [24];
  void *local_290;
  void *local_278;
  code *local_260 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_208 [24];
  void *local_1f0;
  void *local_1d8;
  SO3<mnf::ExpMapMatrix> local_1c0;
  code *local_120 [11];
  void *local_c8;
  void *local_b8;
  code *local_a8 [11];
  void *local_50;
  void *local_40;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_120,2);
  mnf::RealSpace::RealSpace((RealSpace *)local_a8,3);
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&local_1c0);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_300,(Manifold *)local_120,(Manifold *)local_a8);
  mnf::CartesianProduct::multiply((Manifold *)local_300);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_260,&local_1c0.super_Manifold,(Manifold *)local_300);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_438,(Manifold *)local_260,&local_1c0.super_Manifold);
  size = (void *)mnf::Manifold::dim();
  size_00 = (void *)mnf::Manifold::representationDim();
  local_5d8 = size_00;
  if (-1 < (long)size_00) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_610,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_5d8);
    local_5d8 = size;
    if (-1 < (long)size) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_580,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_5d8);
      local_5d8 = size_00;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_570,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_5d8);
      if (size_00 == (void *)0x0) {
        __ptr = (double *)0x0;
      }
      else {
        __ptr = Eigen::internal::conditional_aligned_new_auto<double,true>((size_t)size_00);
      }
      if (size == (void *)0x0) {
        __ptr_00 = (double *)0x0;
      }
      else {
        __ptr_00 = Eigen::internal::conditional_aligned_new_auto<double,true>((size_t)size);
      }
      local_5d8 = (void *)0x64;
      pvStack_5d0 = size_00;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_4f0,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_5d8);
      local_598 = (double *)0x0;
      uStack_590 = 0;
      local_588 = (void *)0x0;
      if ((void *)0x147ae147ae147ae < size) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = operator_delete;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      if (size != (void *)0x0) {
        local_598 = Eigen::internal::conditional_aligned_new_auto<double,true>((long)size * 100);
      }
      uStack_590 = 100;
      local_588 = size;
      if ((void *)0x147ae147ae147ae < size_00) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = operator_delete;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      if (size_00 == (void *)0x0) {
        __ptr_01 = (double *)0x0;
      }
      else {
        __ptr_01 = Eigen::internal::conditional_aligned_new_auto<double,true>((long)size_00 * 100);
      }
      pvVar1 = (void *)mnf::Manifold::dim();
      pvStack_5d0 = (void *)mnf::Manifold::dim();
      local_5d8 = pvVar1;
      if (-1 < (long)((ulong)pvStack_5d0 | (ulong)pvVar1)) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_508,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_5d8);
        pvVar1 = (void *)mnf::Manifold::dim();
        pvStack_5d0 = (void *)mnf::Manifold::dim();
        local_5d8 = pvVar1;
        if (-1 < (long)((ulong)pvStack_5d0 | (ulong)pvVar1)) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_520,
                     (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)&local_5d8);
          pvVar1 = (void *)mnf::Manifold::dim();
          pvStack_5d0 = (void *)mnf::Manifold::dim();
          local_5d8 = pvVar1;
          if (-1 < (long)((ulong)pvStack_5d0 | (ulong)pvVar1)) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_538,
                       (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        *)&local_5d8);
            local_448 = 0;
            local_460 = local_598;
            local_458 = uStack_590;
            local_450 = local_588;
            if ((long)((ulong)local_588 | uStack_590) < 0 && local_598 != (double *)0x0)
            goto LAB_0012a35c;
            local_448 = uStack_590;
            local_5c8 = 0;
            pvStack_5c0 = (void *)0x0;
            local_5d8 = (void *)0x0;
            pvStack_5d0 = (void *)0x0;
            local_5b0 = (void *)0x0;
            uStack_5a8 = 0;
            local_5a0 = 0;
            Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
            construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                       &local_5d8,local_4f0);
            local_5e8 = (void *)0x0;
            uStack_5e0 = 0;
            local_600 = local_610;
            local_5f8 = local_608;
            if (-1 < (long)local_608 || local_610 == (void *)0x0) {
              mnf::Manifold::applyDiffRetractation(local_438,&local_460,&local_5d8,&local_600);
              free(local_5e8);
              free(local_5b0);
              local_320 = 100;
              local_310 = 100;
              local_5c8 = 0;
              pvStack_5c0 = (void *)0x0;
              local_5d8 = (void *)0x0;
              pvStack_5d0 = (void *)0x0;
              local_5b0 = (void *)0x0;
              uStack_5a8 = 0;
              local_5a0 = 0;
              local_328 = __ptr_01;
              local_318 = size_00;
              Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
              construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                        ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                         &local_5d8,&local_598);
              local_5e8 = (void *)0x0;
              uStack_5e0 = 0;
              local_600 = local_610;
              local_5f8 = local_608;
              if (-1 < (long)local_608 || local_610 == (void *)0x0) {
                mnf::Manifold::applyDiffPseudoLog0(local_438,&local_328,&local_5d8,&local_600);
                free(local_5e8);
                free(local_5b0);
                Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 0;
                mnf::utils::set_is_malloc_allowed(false);
                pvStack_5c0 = (void *)0x0;
                uStack_5b8 = 0;
                local_5d8 = local_610;
                pvStack_5d0 = (void *)local_608;
                local_340 = __ptr;
                local_338 = size_00;
                if (-1 < (long)local_608 || local_610 == (void *)0x0) {
                  local_5e8 = (void *)0x0;
                  uStack_5e0 = 0;
                  local_600 = local_580;
                  local_5f8 = local_578;
                  if (-1 < (long)local_578 || local_580 == (void *)0x0) {
                    mnf::Manifold::retractation(local_438,&local_340,&local_5d8,&local_600);
                    free(local_5e8);
                    free(pvStack_5c0);
                    pvStack_5c0 = (void *)0x0;
                    uStack_5b8 = 0;
                    local_5d8 = local_570;
                    pvStack_5d0 = (void *)local_568;
                    local_358 = __ptr_00;
                    local_350 = size;
                    if (-1 < (long)local_568 || local_570 == (void *)0x0) {
                      local_5e8 = (void *)0x0;
                      uStack_5e0 = 0;
                      local_600 = local_610;
                      local_5f8 = local_608;
                      if (-1 < (long)local_608 || local_610 == (void *)0x0) {
                        mnf::Manifold::pseudoLog(local_438,&local_358,&local_5d8,&local_600);
                        free(local_5e8);
                        free(pvStack_5c0);
                        pvStack_5c0 = (void *)0x0;
                        uStack_5b8 = 0;
                        local_5d8 = local_610;
                        pvStack_5d0 = (void *)local_608;
                        local_370 = __ptr_00;
                        local_368 = size;
                        if (-1 < (long)local_608 || local_610 == (void *)0x0) {
                          mnf::Manifold::pseudoLog0(local_438,&local_370,&local_5d8);
                          free(pvStack_5c0);
                          local_470 = 0;
                          local_488 = local_598;
                          local_480 = uStack_590;
                          local_478 = local_588;
                          if ((long)((ulong)local_588 | uStack_590) < 0 &&
                              local_598 != (double *)0x0) {
LAB_0012a35c:
                            pcVar3 = 
                            "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1>>, Level = 0]"
                            ;
                            goto LAB_0012a371;
                          }
                          local_470 = uStack_590;
                          local_5c8 = 0;
                          pvStack_5c0 = (void *)0x0;
                          local_5d8 = (void *)0x0;
                          pvStack_5d0 = (void *)0x0;
                          local_5b0 = (void *)0x0;
                          uStack_5a8 = 0;
                          local_5a0 = 0;
                          Eigen::
                          Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
                          construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                    ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>
                                      *)&local_5d8,local_4f0);
                          local_5e8 = (void *)0x0;
                          uStack_5e0 = 0;
                          local_600 = local_610;
                          local_5f8 = local_608;
                          if (-1 < (long)local_608 || local_610 == (void *)0x0) {
                            mnf::Manifold::applyDiffRetractation
                                      (local_438,&local_488,&local_5d8,&local_600);
                            free(local_5e8);
                            free(local_5b0);
                            local_390 = 100;
                            local_380 = 100;
                            local_5c8 = 0;
                            pvStack_5c0 = (void *)0x0;
                            local_5d8 = (void *)0x0;
                            pvStack_5d0 = (void *)0x0;
                            local_5b0 = (void *)0x0;
                            uStack_5a8 = 0;
                            local_5a0 = 0;
                            local_398 = __ptr_01;
                            local_388 = size_00;
                            Eigen::
                            Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
                            construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                      ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>
                                        *)&local_5d8,&local_598);
                            local_5e8 = (void *)0x0;
                            uStack_5e0 = 0;
                            local_600 = local_610;
                            local_5f8 = local_608;
                            if (-1 < (long)local_608 || local_610 == (void *)0x0) {
                              mnf::Manifold::applyDiffPseudoLog0
                                        (local_438,&local_398,&local_5d8,&local_600);
                              free(local_5e8);
                              free(local_5b0);
                              local_498 = 0;
                              local_4b0 = local_520;
                              local_4a8 = local_518;
                              local_4a0 = local_510;
                              if ((long)(local_510 | local_518) < 0 && local_520 != (void *)0x0)
                              goto LAB_0012a35c;
                              local_498 = local_518;
                              local_5c8 = 0;
                              pvStack_5c0 = (void *)0x0;
                              local_5d8 = (void *)0x0;
                              pvStack_5d0 = (void *)0x0;
                              local_5b0 = (void *)0x0;
                              uStack_5a8 = 0;
                              local_5a0 = 0;
                              Eigen::
                              Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>
                              ::construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                        ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>
                                          *)&local_5d8,local_508);
                              local_5e8 = (void *)0x0;
                              uStack_5e0 = 0;
                              local_600 = local_610;
                              local_5f8 = local_608;
                              if (-1 < (long)local_608 || local_610 == (void *)0x0) {
                                local_548 = (void *)0x0;
                                uStack_540 = 0;
                                local_560 = local_580;
                                local_558 = local_578;
                                if (-1 < (long)local_578 || local_580 == (void *)0x0) {
                                  mnf::Manifold::applyTransport
                                            (local_438,&local_4b0,&local_5d8,&local_600,&local_560);
                                  free(local_548);
                                  free(local_5e8);
                                  free(local_5b0);
                                  local_4c0 = 0;
                                  local_4d8 = local_538;
                                  local_4d0 = local_530;
                                  local_4c8 = local_528;
                                  if ((long)(local_528 | local_530) < 0 && local_538 != (void *)0x0)
                                  goto LAB_0012a35c;
                                  local_4c0 = local_530;
                                  local_5c8 = 0;
                                  pvStack_5c0 = (void *)0x0;
                                  local_5d8 = (void *)0x0;
                                  pvStack_5d0 = (void *)0x0;
                                  local_5b0 = (void *)0x0;
                                  uStack_5a8 = 0;
                                  local_5a0 = 0;
                                  Eigen::
                                  Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>
                                  ::construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>
                                              *)&local_5d8,local_508);
                                  local_5e8 = (void *)0x0;
                                  uStack_5e0 = 0;
                                  local_600 = local_610;
                                  local_5f8 = local_608;
                                  if (-1 < (long)local_608 || local_610 == (void *)0x0) {
                                    local_548 = (void *)0x0;
                                    uStack_540 = 0;
                                    local_560 = local_580;
                                    local_558 = local_578;
                                    if (-1 < (long)local_578 || local_580 == (void *)0x0) {
                                      mnf::Manifold::applyInvTransportOnTheRight
                                                (local_438,&local_4d8,&local_5d8,&local_600,
                                                 &local_560);
                                      free(local_548);
                                      free(local_5e8);
                                      free(local_5b0);
                                      mnf::utils::set_is_malloc_allowed(true);
                                      Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 1;
                                      free(local_538);
                                      free(local_520);
                                      free(local_508[0]);
                                      free(__ptr_01);
                                      free(local_598);
                                      free(local_4f0[0]);
                                      free(__ptr_00);
                                      free(__ptr);
                                      free(local_570);
                                      free(local_580);
                                      free(local_610);
                                      local_438[0] = free;
                                      if (local_3b0 != (void *)0x0) {
                                        operator_delete(local_3b0);
                                      }
                                      if (local_3c8 != (void *)0x0) {
                                        operator_delete(local_3c8);
                                      }
                                      std::
                                      vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                      ::~vector(local_3e0);
                                      mnf::Manifold::~Manifold((Manifold *)local_438);
                                      local_260[0] = free;
                                      if (local_1d8 != (void *)0x0) {
                                        operator_delete(local_1d8);
                                      }
                                      if (local_1f0 != (void *)0x0) {
                                        operator_delete(local_1f0);
                                      }
                                      std::
                                      vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                      ::~vector(local_208);
                                      mnf::Manifold::~Manifold((Manifold *)local_260);
                                      local_300[0] = free;
                                      if (local_278 != (void *)0x0) {
                                        operator_delete(local_278);
                                      }
                                      if (local_290 != (void *)0x0) {
                                        operator_delete(local_290);
                                      }
                                      std::
                                      vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                      ::~vector(local_2a8);
                                      mnf::Manifold::~Manifold((Manifold *)local_300);
                                      local_1c0._0_8_ = &PTR__SO3_00142718;
                                      mnf::ReusableTemporaryMap::~ReusableTemporaryMap
                                                ((ReusableTemporaryMap *)((long)&local_1c0 + 0x58));
                                      mnf::Manifold::~Manifold(&local_1c0.super_Manifold);
                                      local_a8[0] = std::terminate;
                                      free(local_40);
                                      free(local_50);
                                      mnf::Manifold::~Manifold((Manifold *)local_a8);
                                      local_120[0] = std::terminate;
                                      free(local_b8);
                                      free(local_c8);
                                      mnf::Manifold::~Manifold((Manifold *)local_120);
                                      return;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            pcVar3 = 
            "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
            ;
LAB_0012a371:
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar3);
          }
        }
      }
      pcVar3 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
      ;
      goto LAB_0012a3a7;
    }
  }
  pcVar3 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_0012a3a7:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar3);
}

Assistant:

BOOST_AUTO_TEST_CASE(CardProdNoAllocation)
{
  // We only test here that the operations on the manifold do not create
  // temporary. Passing arguments that are not recognize by the Eigen::Ref will
  // create temporaries, but this is the user's fault.
  const int r = 100;
  RealSpace R2(2);
  RealSpace R3(3);
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct R2R3R2(R2, R3);
  R2R3R2.multiply(R2);
  CartesianProduct SO3R2R3R2(RotSpace, R2R3R2);
  CartesianProduct S(SO3R2R3R2, RotSpace);
  Index dim = S.dim();
  Index repDim = S.representationDim();
  Eigen::VectorXd x = Eigen::VectorXd::Random(repDim);
  Eigen::VectorXd p = Eigen::VectorXd::Random(dim);
  Eigen::VectorXd y = Eigen::VectorXd::Random(repDim);
  Eigen::VectorXd z(repDim);
  Eigen::VectorXd d(dim);
  Eigen::MatrixXd J0 = Eigen::MatrixXd::Random(r, repDim);
  Eigen::MatrixXd J1(r, dim);
  Eigen::MatrixXd J2(r, repDim);
  Eigen::MatrixXd H0 = Eigen::MatrixXd::Random(S.dim(), S.dim());
  Eigen::MatrixXd H1 = Eigen::MatrixXd::Random(S.dim(), S.dim());
  Eigen::MatrixXd H2 = Eigen::MatrixXd::Random(S.dim(), S.dim());

  // The first call to the following methods might trigger a memory allocation
  // depending on the size of the Ji and the initial buffer size inside S.
  // However, subsequent calls should not require any allocation, what we check
  // after.
  S.applyDiffRetractation(J1, J0, x);
  S.applyDiffPseudoLog0(J2, J1, x);

  Eigen::internal::set_is_malloc_allowed(false);
  utils::set_is_malloc_allowed(false);
  {
    S.retractation(z, x, p);
    S.pseudoLog(d, y, x);
    S.pseudoLog0(d, x);
    S.applyDiffRetractation(J1, J0, x);
    S.applyDiffPseudoLog0(J2, J1, x);
    S.applyTransport(H1, H0, x, p);
    S.applyInvTransportOnTheRight(H2, H0, x, p);
  }
  utils::set_is_malloc_allowed(true);
  Eigen::internal::set_is_malloc_allowed(true);
}